

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCxxModuleBmiGenerator.cxx
# Opt level: O2

string * __thiscall
cmInstallCxxModuleBmiGenerator::GetScriptLocation
          (string *__return_storage_ptr__,cmInstallCxxModuleBmiGenerator *this,string *config)

{
  char *local_a0;
  string local_98;
  cmAlphaNum local_78;
  cmAlphaNum local_48;
  
  if (config->_M_string_length == 0) {
    local_a0 = "noconfig";
  }
  else {
    local_a0 = (config->_M_dataplus)._M_p;
  }
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_(&local_98,this->Target);
  local_48.View_._M_len = local_98._M_string_length;
  local_48.View_._M_str = local_98._M_dataplus._M_p;
  local_78.View_._M_len = 0x18;
  local_78.View_._M_str = "/install-cxx-module-bmi-";
  cmStrCat<char_const*,char[7]>
            (__return_storage_ptr__,&local_48,&local_78,&local_a0,(char (*) [7])0x64a37d);
  std::__cxx11::string::~string((string *)&local_98);
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallCxxModuleBmiGenerator::GetScriptLocation(
  std::string const& config) const
{
  char const* config_name = config.c_str();
  if (config.empty()) {
    config_name = "noconfig";
  }
  return cmStrCat(this->Target->GetSupportDirectory(),
                  "/install-cxx-module-bmi-", config_name, ".cmake");
}